

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMregister_handler(CMFormat format,CMHandlerFunc handler,void *client_data)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s1;
  long in_RDX;
  CMFormat in_RSI;
  long *in_RDI;
  int i;
  CManager_conflict cm;
  int local_24;
  
  lVar1 = *in_RDI;
  in_RDI[5] = (long)in_RSI;
  in_RDI[6] = in_RDX;
  for (local_24 = 0; local_24 < *(int *)(lVar1 + 0x28); local_24 = local_24 + 1) {
    uVar3 = FMFormat_of_original(*(undefined8 *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48));
    __s1 = (char *)name_of_FMformat(uVar3);
    iVar2 = strcmp(__s1,(char *)in_RDI[1]);
    if (iVar2 == 0) {
      if ((int)in_RDI[8] != 0) {
        CMcomplete_format_registration(in_RSI,(int)((ulong)in_RDX >> 0x20));
      }
      if (*(long *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48) == in_RDI[3]) {
        if (*(long *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48 + 8) == 0) {
          *(CMFormat *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48 + 8) = in_RSI;
          *(long *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48 + 0x10) = in_RDX;
        }
        else if ((*(CMFormat *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48 + 8) != in_RSI) ||
                (*(long *)(*(long *)(lVar1 + 0x30) + (long)local_24 * 0x48 + 0x10) != in_RDX)) {
          fprintf(_stderr,
                  "Warning, CMregister_handler() called multiple times for the same format with different handler or client_data\n"
                 );
          fprintf(_stderr,"Repeated calls will be ignored\n");
        }
      }
    }
  }
  return;
}

Assistant:

void
INT_CMregister_handler(CMFormat format, CMHandlerFunc handler,
		       void *client_data)
{
    CManager cm = format->cm;
    int i;
    format->handler = handler;
    format->client_data = client_data;

    for (i=0; i< cm->in_format_count; i++) {
	if (strcmp(name_of_FMformat(FMFormat_of_original(cm->in_formats[i].format)), format->format_name) == 0) {
	    if (format->registration_pending) {
	        CMcomplete_format_registration(format, 1);
	    }
	    if (cm->in_formats[i].format == format->ffsformat) {
	        if (!cm->in_formats[i].handler) {
		    cm->in_formats[i].handler = handler;
		    cm->in_formats[i].client_data = client_data;
		} else if ((cm->in_formats[i].handler != handler) ||
			   (cm->in_formats[i].client_data != client_data)) {
		    fprintf(stderr, "Warning, CMregister_handler() called multiple times for the same format with different handler or client_data\n");
		    fprintf(stderr, "Repeated calls will be ignored\n");
		}
	    }
	}
    }
}